

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall MDIOSimulationDataGenerator::CreateTAForRead(MDIOSimulationDataGenerator *this)

{
  int iVar1;
  MDIOSimulationDataGenerator *this_local;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMdio);
  iVar1 = (int)this;
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  return;
}

Assistant:

void MDIOSimulationDataGenerator::CreateTAForRead()
{
    mMdio->TransitionIfNeeded( BIT_HIGH );
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
    mMdc->Transition(); // MDC posedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
    mMdio->Transition(); // MDIO line goes down (by the slave)
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
    mMdc->Transition(); // MDC negedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
    mMdc->Transition(); // MDC posedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
}